

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_print_syntaxv(FILE *fp,void **argtable,char *suffix)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  char *__format;
  int iVar4;
  byte *pbVar5;
  char syntax [200];
  char *in_stack_fffffffffffffef8;
  char local_f8 [200];
  
  pbVar5 = (byte *)*argtable;
  if (pbVar5 != (byte *)0x0) {
    lVar3 = 0;
    do {
      if ((*pbVar5 & 1) != 0) break;
      memset(local_f8,0,200);
      arg_cat_optionv(local_f8,*(size_t *)(pbVar5 + 8),*(char **)(pbVar5 + 0x10),
                      *(char **)(pbVar5 + 0x18),(char *)(ulong)(*pbVar5 & 4),0x10b632,
                      in_stack_fffffffffffffef8);
      pvVar1 = argtable[lVar3];
      iVar2 = *(int *)((long)pvVar1 + 0x28);
      if (0 < iVar2) {
        iVar4 = 0;
        do {
          fprintf((FILE *)fp," %s",local_f8);
          iVar4 = iVar4 + 1;
          pvVar1 = argtable[lVar3];
          iVar2 = *(int *)((long)pvVar1 + 0x28);
        } while (iVar4 < iVar2);
      }
      iVar4 = *(int *)((long)pvVar1 + 0x2c) - iVar2;
      if (*(int *)((long)pvVar1 + 0x2c) != iVar2) {
        if (iVar4 == 2) {
          fprintf((FILE *)fp," [%s] [%s]",local_f8,local_f8);
        }
        else {
          if (iVar4 == 1) {
            __format = " [%s]";
          }
          else {
            __format = " [%s]...";
          }
          fprintf((FILE *)fp,__format,local_f8);
        }
      }
      pbVar5 = (byte *)argtable[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (pbVar5 != (byte *)0x0);
  }
  if (suffix != (char *)0x0) {
    fputs(suffix,(FILE *)fp);
  }
  return;
}

Assistant:

void arg_print_syntaxv(FILE * fp, void * *argtable, const char * suffix) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	int i, tabindex;

	/* print remaining options in abbreviated style */
	for (tabindex = 0;
			table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR);
			tabindex++) {
		char syntax[200] = "";
		const char * shortopts, *longopts, *datatype;

		shortopts = table[tabindex]->shortopts;
		longopts  = table[tabindex]->longopts;
		datatype  = table[tabindex]->datatype;
		arg_cat_optionv(syntax,
						sizeof(syntax),
						shortopts,
						longopts,
						datatype,
						table[tabindex]->flag & ARG_HASOPTVALUE,
						"|");

		/* print mandatory options */
		for (i = 0; i < table[tabindex]->mincount; i++) {
			fprintf(fp, " %s", syntax);
		}

		/* print optional args enclosed in "[..]" */
		switch ( table[tabindex]->maxcount - table[tabindex]->mincount ) {
			case 0:
				break;

			case 1:
				fprintf(fp, " [%s]", syntax);
				break;

			case 2:
				fprintf(fp, " [%s] [%s]", syntax, syntax);
				break;

			default:
				fprintf(fp, " [%s]...", syntax);
				break;
		}
	}

	if (suffix) {
		fprintf(fp, "%s", suffix);
	}
}